

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_gzip.c
# Opt level: O3

ssize_t gzip_filter_read(archive_read_filter *self,void **p)

{
  uInt uVar1;
  z_streamp strm;
  private_data_conflict1 *state;
  z_streamp strm_00;
  uint uVar2;
  int iVar3;
  ssize_t request;
  uLong uVar4;
  Bytef *pBVar5;
  void *pvVar6;
  long lVar7;
  char *fmt;
  int64_t request_00;
  archive_read_filter *filter;
  archive_read *a;
  ssize_t avail_in;
  ssize_t local_48;
  uInt local_40;
  undefined4 uStack_3c;
  void **local_38;
  
  strm = (z_streamp)self->data;
  strm->next_out = *(Bytef **)&strm[1].avail_in;
  uVar1 = (uInt)strm[1].total_in;
  strm->avail_out = uVar1;
  local_38 = p;
  if (uVar1 != 0) {
    do {
      if (*(char *)&strm[1].state != '\0') break;
      if (*(char *)&strm[1].next_in == '\0') {
        state = (private_data_conflict1 *)self->data;
        request = peek_at_header(self->upstream,(int *)0x0,state);
        if (request != 0) {
          __archive_read_filter_consume(self->upstream,request);
          uVar4 = cm_zlib_z_crc32(0,(uchar *)0x0,0);
          state->crc = uVar4;
          pBVar5 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,(ssize_t *)&local_40);
          (state->stream).next_in = pBVar5;
          (state->stream).avail_in = local_40;
          uVar2 = cm_zlib_inflateInit2_((z_streamp)state,-0xf,"1.2.12",0x70);
          if (uVar2 == 0) {
            state->in_stream = '\x01';
            goto LAB_0013c345;
          }
          if (uVar2 == 0xfffffffa) {
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid library version";
          }
          else {
            if (uVar2 == 0xfffffffc) {
              a = self->archive;
              fmt = "Internal error initializing compression library: out of memory";
              iVar3 = 0xc;
              goto LAB_0013c48c;
            }
            if (uVar2 != 0xfffffffe) {
              archive_set_error(&self->archive->archive,-1,
                                "Internal error initializing compression library:  Zlib error %d",
                                (ulong)uVar2);
              return -0x1e;
            }
            a = self->archive;
            fmt = "Internal error initializing compression library: invalid setup parameter";
          }
LAB_0013c487:
          iVar3 = -1;
LAB_0013c48c:
          archive_set_error(&a->archive,iVar3,fmt);
          return -0x1e;
        }
        *(undefined1 *)&strm[1].state = 1;
        break;
      }
LAB_0013c345:
      pBVar5 = (Bytef *)__archive_read_filter_ahead(self->upstream,1,&local_48);
      strm->next_in = pBVar5;
      if (pBVar5 == (Bytef *)0x0) {
        a = self->archive;
        fmt = "truncated gzip input";
        goto LAB_0013c487;
      }
      if (0xffffffff < local_48) {
        local_48 = 0xffffffff;
      }
      strm->avail_in = (uInt)local_48;
      iVar3 = cm_zlib_inflate(strm,0);
      if (iVar3 == 1) {
        __archive_read_filter_consume(self->upstream,local_48 - (ulong)strm->avail_in);
        strm_00 = (z_streamp)self->data;
        *(undefined1 *)&strm_00[1].next_in = 0;
        iVar3 = cm_zlib_inflateEnd(strm_00);
        if (iVar3 != 0) {
          a = self->archive;
          fmt = "Failed to clean up gzip decompressor";
          goto LAB_0013c487;
        }
        pvVar6 = __archive_read_filter_ahead(self->upstream,8,(ssize_t *)&local_40);
        if (pvVar6 == (void *)0x0) {
          return -0x1e;
        }
        if (CONCAT44(uStack_3c,local_40) == 0) {
          return -0x1e;
        }
        filter = self->upstream;
        request_00 = 8;
      }
      else {
        if (iVar3 != 0) {
          a = self->archive;
          fmt = "gzip decompression failed";
          goto LAB_0013c487;
        }
        filter = self->upstream;
        request_00 = local_48 - (ulong)strm->avail_in;
      }
      __archive_read_filter_consume(filter,request_00);
    } while (strm->avail_out != 0);
  }
  pvVar6 = *(void **)&strm[1].avail_in;
  lVar7 = (long)strm->next_out - (long)pvVar6;
  strm[1].next_out = strm[1].next_out + lVar7;
  if (lVar7 == 0) {
    pvVar6 = (void *)0x0;
  }
  *local_38 = pvVar6;
  return lVar7;
}

Assistant:

static ssize_t
gzip_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in, max_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = (uInt)state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		/* If we're not in a stream, read a header
		 * and initialize the decompression library. */
		if (!state->in_stream) {
			ret = consume_header(self);
			if (ret == ARCHIVE_EOF) {
				state->eof = 1;
				break;
			}
			if (ret < ARCHIVE_OK)
				return (ret);
		}

		/* Peek at the next available data. */
		/* ZLib treats stream.next_in as const but doesn't declare
		 * it so, hence this ugly cast. */
		state->stream.next_in = (unsigned char *)(uintptr_t)
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated gzip input");
			return (ARCHIVE_FATAL);
		}
		if (UINT_MAX >= SSIZE_MAX)
			max_in = SSIZE_MAX;
		else
			max_in = UINT_MAX;
		if (avail_in > max_in)
			avail_in = max_in;
		state->stream.avail_in = (uInt)avail_in;

		/* Decompress and consume some of that data. */
		ret = inflate(&(state->stream), 0);
		switch (ret) {
		case Z_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			break;
		case Z_STREAM_END: /* Found end of stream. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			/* Consume the stream trailer; release the
			 * decompression library. */
			ret = consume_trailer(self);
			if (ret < ARCHIVE_OK)
				return (ret);
			break;
		default:
			/* Return an error. */
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "gzip decompression failed");
			return (ARCHIVE_FATAL);
		}
	}

	/* We've read as much as we can. */
	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else
		*p = state->out_block;
	return (decompressed);
}